

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  size_t size;
  uint uVar1;
  LodePNGDecompressSettings *in_RSI;
  undefined8 *in_RDI;
  uint error;
  uchar *unaff_retaddr;
  ucvector v;
  ucvector local_40 [2];
  
  size._0_4_ = in_RSI->ignore_adler32;
  size._4_4_ = in_RSI->ignore_nlen;
  ucvector_init(local_40,(uchar *)*in_RDI,size);
  uVar1 = lodepng_inflatev((ucvector *)v.data,unaff_retaddr,(size_t)in_RDI,in_RSI);
  *in_RDI = local_40[0].data;
  in_RSI->ignore_adler32 = (undefined4)local_40[0].size;
  in_RSI->ignore_nlen = local_40[0].size._4_4_;
  return uVar1;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}